

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O2

void __thiscall google::FlagSaverImpl::SaveFromRegistry(FlagSaverImpl *this)

{
  pointer *pppCVar1;
  CommandLineFlag *src;
  char *pcVar2;
  pointer __src;
  char *pcVar3;
  char *pcVar4;
  CommandLineFlag *this_00;
  FlagValue *pFVar5;
  FlagValue *pFVar6;
  ulong uVar7;
  pointer ppCVar8;
  _Rb_tree_node_base *p_Var9;
  FlagRegistry *pFVar10;
  size_t __n;
  Mutex *this_01;
  ulong uVar11;
  ulong uVar12;
  
  this_01 = &this->main_registry_->lock_;
  gflags_mutex_namespace::Mutex::Lock(this_01);
  if ((this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __assert_fail("backup_registry_.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                  ,0x678,"void google::FlagSaverImpl::SaveFromRegistry()");
  }
  pFVar10 = this->main_registry_;
  p_Var9 = (pFVar10->flags_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var9 == &(pFVar10->flags_)._M_t._M_impl.super__Rb_tree_header) {
      gflags_mutex_namespace::Mutex::Unlock(this_01);
      return;
    }
    src = (CommandLineFlag *)p_Var9[1]._M_parent;
    this_00 = (CommandLineFlag *)operator_new(0x38);
    pcVar3 = src->name_;
    pcVar4 = src->help_;
    pcVar2 = src->file_;
    pFVar5 = anon_unknown_1::FlagValue::New(src->current_);
    pFVar6 = anon_unknown_1::FlagValue::New(src->defvalue_);
    this_00->name_ = pcVar3;
    this_00->help_ = pcVar4;
    this_00->file_ = pcVar2;
    this_00->modified_ = false;
    this_00->defvalue_ = pFVar6;
    this_00->current_ = pFVar5;
    this_00->validate_fn_proto_ = (ValidateFnProto)0x0;
    anon_unknown_1::CommandLineFlag::CopyFrom(this_00,src);
    ppCVar8 = (this->backup_registry_).
              super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppCVar8 ==
        (this->backup_registry_).
        super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __src = (this->backup_registry_).
              super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
      __n = (long)ppCVar8 - (long)__src;
      if (__n == 0x7ffffffffffffff8) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar12 = (long)__n >> 3;
      uVar7 = uVar12;
      if (ppCVar8 == __src) {
        uVar7 = 1;
      }
      uVar11 = uVar7 + uVar12;
      if (0xffffffffffffffe < uVar11) {
        uVar11 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar7,uVar12)) {
        uVar11 = 0xfffffffffffffff;
      }
      if (uVar11 == 0) {
        ppCVar8 = (pointer)0x0;
      }
      else {
        ppCVar8 = (pointer)operator_new(uVar11 * 8);
      }
      ppCVar8[uVar12] = this_00;
      if (0 < (long)__n) {
        memmove(ppCVar8,__src,__n);
      }
      if (__src != (pointer)0x0) {
        operator_delete(__src);
      }
      (this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_start = ppCVar8;
      (this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)ppCVar8 + __n + 8);
      (this->backup_registry_).
      super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppCVar8 + uVar11;
    }
    else {
      *ppCVar8 = this_00;
      pppCVar1 = &(this->backup_registry_).
                  super__Vector_base<google::(anonymous_namespace)::CommandLineFlag_*,_std::allocator<google::(anonymous_namespace)::CommandLineFlag_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppCVar1 = *pppCVar1 + 1;
    }
    p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9);
    pFVar10 = this->main_registry_;
  } while( true );
}

Assistant:

void SaveFromRegistry() {
    FlagRegistryLock frl(main_registry_);
    assert(backup_registry_.empty());   // call only once!
    for (FlagRegistry::FlagConstIterator it = main_registry_->flags_.begin();
         it != main_registry_->flags_.end();
         ++it) {
      const CommandLineFlag* main = it->second;
      // Sets up all the const variables in backup correctly
      CommandLineFlag* backup = new CommandLineFlag(
          main->name(), main->help(), main->filename(),
          main->current_->New(), main->defvalue_->New());
      // Sets up all the non-const variables in backup correctly
      backup->CopyFrom(*main);
      backup_registry_.push_back(backup);   // add it to a convenient list
    }
  }